

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::file_mapping::file_mapping
          (file_mapping *this,file_handle *file,open_mode_t mode,int64_t file_size)

{
  size_t __len;
  error_code *peVar1;
  void *__addr;
  int *piVar2;
  error_code local_40;
  int64_t local_30;
  
  (this->super_enable_shared_from_this<libtorrent::aux::file_mapping>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<libtorrent::aux::file_mapping>)._M_weak_this.
  super___weak_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40._0_8_ = file_size;
  if ((mode.m_val & 1) == 0) {
    local_30 = file_handle::get_size(file);
    peVar1 = &local_40;
    if (local_30 <= file_size) {
      peVar1 = (error_code *)&local_30;
    }
  }
  else {
    peVar1 = &local_40;
  }
  __len._0_4_ = peVar1->val_;
  __len._4_1_ = peVar1->failed_;
  __len._5_3_ = *(undefined3 *)&peVar1->field_0x5;
  this->m_size = __len;
  (this->m_file).m_fd = file->m_fd;
  file->m_fd = -1;
  if ((mode.m_val >> 9 & 1) == 0) {
    __addr = mmap64((void *)0x0,__len,(mode.m_val & 1) * 2 + 1,1,(this->m_file).m_fd,0);
  }
  else {
    __addr = (void *)0x0;
  }
  this->m_mapping = __addr;
  if (((mode.m_val >> 9 & 1) == 0) && (__addr == (void *)0xffffffffffffffff)) {
    piVar2 = __errno_location();
    local_40.failed_ = *piVar2 != 0;
    local_40.val_ = *piVar2;
    local_40.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_30 = CONCAT71(local_30._1_7_,0x2d);
    throw_ex<libtorrent::storage_error,boost::system::error_code,libtorrent::operation_t>
              (&local_40,(operation_t *)&local_30);
  }
  if (file_size < 1) {
    return;
  }
  madvise(__addr,this->m_size,(uint)((mode.m_val & 0x10) == 0) * 2 + 0x10);
  return;
}

Assistant:

file_mapping::file_mapping(file_handle file, open_mode_t const mode, std::int64_t const file_size)
	: m_size(memory_map_size(mode, file_size, file))
	, m_file(std::move(file))
	, m_mapping((mode & open_mode::no_mmap) ? nullptr
		: mmap(nullptr, static_cast<std::size_t>(m_size)
			, mmap_prot(mode), mmap_flags(mode), m_file.fd(), 0))
{
	TORRENT_ASSERT(file_size >= 0);
	// you can't create an mmap of size 0, so we just set it to null. We
	// still need to create the empty file.
	if (!(mode & open_mode::no_mmap) && m_mapping == map_failed)
	{
		throw_ex<storage_error>(error_code(errno, system_category()), operation_t::file_mmap);
	}

#if TORRENT_USE_MADVISE
	if (file_size > 0)
	{
		int const advise = ((mode & open_mode::random_access) ? 0 : MADV_SEQUENTIAL)
#ifdef MADV_DONTDUMP
		// on versions of linux that support it, ask for this region to not be
		// included in coredumps (mostly to make the coredumps more manageable
		// with large disk caches)
		// ignore errors here, since this is best-effort
			| MADV_DONTDUMP
#endif
#ifdef MADV_NOCORE
		// This is the BSD counterpart to exclude a range from core dumps
			| MADV_NOCORE
#endif
		;
		if (advise != 0)
			madvise(m_mapping, static_cast<std::size_t>(m_size), advise);
	}
#endif
}